

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O3

char * __thiscall
Memory::LargeHeapBucket::TryAllocFromFreeList
          (LargeHeapBucket *this,Recycler *recycler,size_t sizeCat,ObjectInfoBits attributes)

{
  undefined4 *puVar1;
  LargeHeapBlockFreeList *pLVar2;
  code *pcVar3;
  bool bVar4;
  char *pcVar5;
  undefined6 in_register_0000000a;
  undefined8 *in_FS_OFFSET;
  
  if (0x3ff < (uint)CONCAT62(in_register_0000000a,attributes)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x178,"((attributes & InternalObjectInfoBitMask) == attributes)",
                       "(attributes & InternalObjectInfoBitMask) == attributes");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar1 = 0;
  }
  pLVar2 = this->freeList;
  while( true ) {
    if (pLVar2 == (LargeHeapBlockFreeList *)0x0) {
      return (char *)0x0;
    }
    pcVar5 = LargeHeapBlock::TryAllocFromFreeList(pLVar2->heapBlock,sizeCat,attributes);
    if (pcVar5 != (char *)0x0) break;
    if ((recycler->recyclerFlagsTable->Verbose == true) &&
       ((bVar4 = Js::Phases::IsEnabled(&recycler->recyclerFlagsTable->Trace,MemoryAllocationPhase),
        bVar4 || (bVar4 = Js::Phases::IsEnabled
                                    (&recycler->recyclerFlagsTable->Trace,LargeMemoryAllocationPhase
                                    ), bVar4)))) {
      Output::Print(L"Unable to allocate object of size 0x%x from freelist\n",sizeCat);
    }
    pLVar2 = pLVar2->next;
  }
  return pcVar5;
}

Assistant:

char *
LargeHeapBucket::TryAllocFromFreeList(Recycler * recycler, size_t sizeCat, ObjectInfoBits attributes)
{
    Assert((attributes & InternalObjectInfoBitMask) == attributes);

    LargeHeapBlockFreeList* freeListEntry = this->freeList;

    // Walk through the free list, find the first entry that can fit our desired size
    while (freeListEntry)
    {
        LargeHeapBlock* heapBlock = freeListEntry->heapBlock;

        char * memBlock = heapBlock->TryAllocFromFreeList(sizeCat, attributes);
        if (memBlock)
        {
            // Don't need to verify zero fill here since we will do it in LargeHeapBucket::Alloc
            return memBlock;
        }
        else
        {
#if DBG
            LargeAllocationVerboseTrace(recycler->GetRecyclerFlagsTable(), _u("Unable to allocate object of size 0x%x from freelist\n"), sizeCat);
#endif
        }

        freeListEntry = freeListEntry->next;
    }
    return nullptr;
}